

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

void __thiscall wasm::BinaryInstWriter::visitArrayNew(BinaryInstWriter *this,ArrayNew *curr)

{
  BufferWithRandomAccess *pBVar1;
  WasmBinaryWriter *this_00;
  bool bVar2;
  HeapType type;
  U32LEB local_20;
  U32LEB local_1c;
  ArrayNew *local_18;
  ArrayNew *curr_local;
  BinaryInstWriter *this_local;
  
  local_18 = curr;
  curr_local = (ArrayNew *)this;
  BufferWithRandomAccess::operator<<(this->o,-5);
  bVar2 = ArrayNew::isWithDefault(local_18);
  if (bVar2) {
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_1c,7);
    BufferWithRandomAccess::operator<<(pBVar1,local_1c);
  }
  else {
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_20,6);
    BufferWithRandomAccess::operator<<(pBVar1,local_20);
  }
  this_00 = this->parent;
  type = wasm::Type::getHeapType
                   (&(local_18->super_SpecificExpression<(wasm::Expression::Id)70>).super_Expression
                     .type);
  WasmBinaryWriter::writeIndexedHeapType(this_00,type);
  return;
}

Assistant:

void BinaryInstWriter::visitArrayNew(ArrayNew* curr) {
  o << int8_t(BinaryConsts::GCPrefix);
  if (curr->isWithDefault()) {
    o << U32LEB(BinaryConsts::ArrayNewDefault);
  } else {
    o << U32LEB(BinaryConsts::ArrayNew);
  }
  parent.writeIndexedHeapType(curr->type.getHeapType());
}